

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O3

int WriteWebP(WebPMux *mux,char *filename)

{
  WebPMuxError WVar1;
  int iVar2;
  WebPData local_20;
  
  WVar1 = WebPMuxAssemble(mux,&local_20);
  if (WVar1 == WEBP_MUX_OK) {
    iVar2 = WriteData(filename,&local_20);
    WebPFree(local_20.bytes);
  }
  else {
    WriteWebP_cold_1();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int WriteWebP(WebPMux* const mux, const char* filename) {
  int ok;
  WebPData webp_data;
  const WebPMuxError err = WebPMuxAssemble(mux, &webp_data);
  if (err != WEBP_MUX_OK) {
    fprintf(stderr, "Error (%s) assembling the WebP file.\n", ErrorString(err));
    return 0;
  }
  ok = WriteData(filename, &webp_data);
  WebPDataClear(&webp_data);
  return ok;
}